

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall
Deck::discard(Deck *this,Hand *hand,vector<CardType,_std::allocator<CardType>_> *discardedCards)

{
  value_type vVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  length_error *this_01;
  bool bVar6;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_50;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_48;
  const_iterator local_40;
  int local_34;
  uint local_30;
  int removedCard;
  uint counter;
  int i_1;
  int i;
  uint initialHandSize;
  vector<CardType,_std::allocator<CardType>_> *discardedCards_local;
  Hand *hand_local;
  Deck *this_local;
  
  _i = discardedCards;
  discardedCards_local = (vector<CardType,_std::allocator<CardType>_> *)hand;
  hand_local = (Hand *)this;
  pvVar2 = Hand::getHand(hand);
  sVar3 = std::vector<CardType,_std::allocator<CardType>_>::size(pvVar2);
  i_1 = (int)sVar3;
  for (counter = 0; (int)counter < 3; counter = counter + 1) {
    pvVar2 = this->discardPointer;
    pvVar4 = std::vector<CardType,_std::allocator<CardType>_>::at(discardedCards,(long)(int)counter)
    ;
    std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar2,pvVar4);
  }
  for (removedCard = 0; removedCard < 3; removedCard = removedCard + 1) {
    local_30 = 0;
    local_34 = 0;
    while( true ) {
      bVar6 = false;
      if (local_34 == 0) {
        uVar5 = (ulong)local_30;
        pvVar2 = Hand::getHand((Hand *)discardedCards_local);
        sVar3 = std::vector<CardType,_std::allocator<CardType>_>::size(pvVar2);
        bVar6 = uVar5 < sVar3;
      }
      if (!bVar6) break;
      pvVar2 = Hand::getHand((Hand *)discardedCards_local);
      pvVar4 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar2,(ulong)local_30);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<CardType,_std::allocator<CardType>_>::at
                         (discardedCards,(long)removedCard);
      if (vVar1 == *pvVar4) {
        pvVar2 = Hand::getHand((Hand *)discardedCards_local);
        this_00 = Hand::getHand((Hand *)discardedCards_local);
        local_50._M_current =
             (CardType *)std::vector<CardType,_std::allocator<CardType>_>::begin(this_00);
        local_48 = __gnu_cxx::
                   __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                   ::operator+(&local_50,(ulong)local_30);
        __gnu_cxx::__normal_iterator<CardType_const*,std::vector<CardType,std::allocator<CardType>>>
        ::__normal_iterator<CardType*>
                  ((__normal_iterator<CardType_const*,std::vector<CardType,std::allocator<CardType>>>
                    *)&local_40,&local_48);
        std::vector<CardType,_std::allocator<CardType>_>::erase(pvVar2,local_40);
        local_34 = 1;
      }
      else {
        local_30 = local_30 + 1;
      }
    }
  }
  pvVar2 = Hand::getHand((Hand *)discardedCards_local);
  sVar3 = std::vector<CardType,_std::allocator<CardType>_>::size(pvVar2);
  if (sVar3 != (uint)i_1) {
    return;
  }
  this_01 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_01,
             "The three cards were not removed from the hand once exchanged successfully. System exiting."
            );
  __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Deck::discard(Hand* hand, std::vector<CardType> discardedCards) {

    unsigned int initialHandSize = hand->getHand()->size();

    for (int i = 0; i < 3; i++) {
        Deck::discardPointer->push_back(discardedCards.at(i));
    }

    for (int i = 0; i < 3; i++) {
        unsigned int counter = 0; // position in vector
        int removedCard = 0;

        while (removedCard == 0 && counter <
                                   hand->getHand()->size()) { //stop once the vector has been gone through completely or a card was removed
            if (hand->getHand()->at(counter) == discardedCards.at(i)) {
                hand->getHand()->erase(hand->getHand()->begin() + counter);
                removedCard = 1;
            } else {
                counter++;
            }
        }
    }

    // checks if the cards were removed from the hand as expected
    if (hand->getHand()->size() == initialHandSize) {
        throw std::length_error(
                "The three cards were not removed from the hand once exchanged successfully. System exiting.");
    }
}